

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_factorization.cc
# Opt level: O2

void __thiscall
ipx::LuFactorization::Factorize
          (LuFactorization *this,Int dim,Int *Bbegin,Int *Bend,Int *Bi,double *Bx,double pivottol,
          bool strict_abs_pivottol,SparseMatrix *L,SparseMatrix *U,
          vector<int,_std::allocator<int>_> *rowperm,vector<int,_std::allocator<int>_> *colperm,
          vector<int,_std::allocator<int>_> *dependent_cols)

{
  double dVar1;
  double dVar2;
  pointer piVar3;
  pointer piVar4;
  int *piVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  size_t sVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  undefined4 in_register_00000034;
  int iVar14;
  ulong uVar15;
  size_type __n;
  int *piVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  reference rVar21;
  allocator_type local_17a;
  bool local_179;
  Vector lhs;
  Vector rhs;
  undefined8 local_148;
  vector<bool,_std::allocator<bool>_> dependent;
  vector<int,_std::allocator<int>_> permuted_row;
  SparseMatrix local_b0;
  
  (*this->_vptr_LuFactorization[2])(SUB84(pivottol,0),this,CONCAT44(in_register_00000034,dim));
  iVar11 = (int)((ulong)((long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  std::valarray<double>::valarray(&rhs,(long)iVar11);
  std::valarray<double>::valarray(&lhs,(long)iVar11);
  piVar3 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  piVar4 = (rowperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  InversePerm(&permuted_row,rowperm);
  uVar15 = (ulong)((long)piVar3 - (long)piVar4) >> 2;
  iVar14 = (int)uVar15;
  local_179 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&dependent,(long)iVar14,&local_179,&local_17a);
  piVar5 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (piVar16 = (dependent_cols->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start; piVar16 != piVar5; piVar16 = piVar16 + 1) {
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[](&dependent,(long)*piVar16);
    *rVar21._M_p = *rVar21._M_p | rVar21._M_mask;
  }
  __n = 0;
  SparseMatrix::SparseMatrix(&local_b0,iVar14,0);
  uVar15 = uVar15 & 0xffffffff;
  if (iVar14 < 1) {
    uVar15 = __n;
  }
  for (; __n != uVar15; __n = __n + 1) {
    rVar21 = std::vector<bool,_std::allocator<bool>_>::operator[](&dependent,__n);
    if ((*rVar21._M_p & rVar21._M_mask) == 0) {
      iVar14 = (colperm->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[__n];
      for (lVar12 = (long)Bbegin[iVar14]; lVar12 < Bend[iVar14]; lVar12 = lVar12 + 1) {
        SparseMatrix::push_back
                  (&local_b0,
                   permuted_row.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[Bi[lVar12]],Bx[lVar12]);
      }
    }
    else {
      SparseMatrix::push_back(&local_b0,(Int)__n,1.0);
    }
    SparseMatrix::add_column(&local_b0);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&dependent.super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&permuted_row.super__Vector_base<int,_std::allocator<int>_>);
  dVar6 = Onenorm(&local_b0);
  dVar7 = Infnorm(&local_b0);
  sVar10 = rhs._M_size;
  dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::valarray<double>::operator=(&lhs,(double *)&dependent);
  uVar13 = 0;
  uVar15 = sVar10 & 0xffffffff;
  if ((int)sVar10 < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    dVar1 = *(double *)(&DAT_003990c0 + (ulong)(0.0 <= lhs._M_data[uVar13]) * 8);
    rhs._M_data[uVar13] = dVar1;
    dVar1 = dVar1 + lhs._M_data[uVar13];
    lhs._M_data[uVar13] = dVar1;
    ScatterColumn(L,(Int)uVar13,-dVar1,&lhs);
  }
  TriangularSolve(U,&lhs,'n',"upper",0);
  dVar1 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'N');
  dVar8 = Onenorm(&rhs);
  dependent.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  std::valarray<double>::operator=(&lhs,(double *)&dependent);
  uVar13 = 0;
  uVar15 = rhs._M_size & 0xffffffff;
  if ((int)rhs._M_size < 1) {
    uVar15 = uVar13;
  }
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    dVar9 = DotColumn(U,(Int)uVar13,&lhs);
    dVar2 = lhs._M_data[uVar13];
    lhs._M_data[uVar13] = dVar2 - dVar9;
    dVar2 = *(double *)(&DAT_003990c0 + (ulong)(0.0 <= dVar2 - dVar9) * 8);
    rhs._M_data[uVar13] = dVar2;
    dVar2 = dVar2 + lhs._M_data[uVar13];
    lhs._M_data[uVar13] = dVar2;
    lhs._M_data[uVar13] =
         dVar2 / (U->values_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(long)(U->colptr_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar13 + 1] + -1];
  }
  TriangularSolve(L,&lhs,'t',"lower",1);
  dVar2 = Onenorm(&lhs);
  MultiplyAdd(&local_b0,&lhs,-1.0,&rhs,'T');
  dVar9 = Onenorm(&rhs);
  auVar19._8_8_ = dVar9;
  auVar19._0_8_ = dVar8;
  auVar20._8_8_ = (double)iVar11 + dVar2 * dVar7;
  auVar20._0_8_ = (double)iVar11 + dVar1 * dVar6;
  auVar20 = divpd(auVar19,auVar20);
  uVar17 = auVar20._8_4_;
  uVar18 = auVar20._12_4_;
  if (auVar20._8_8_ <= auVar20._0_8_) {
    uVar17 = auVar20._0_4_;
    uVar18 = auVar20._4_4_;
  }
  local_148 = (double)CONCAT44(uVar18,uVar17);
  SparseMatrix::~SparseMatrix(&local_b0);
  operator_delete(lhs._M_data);
  operator_delete(rhs._M_data);
  this->stability_ = local_148;
  return;
}

Assistant:

void LuFactorization::Factorize(Int dim, const Int* Bbegin, const Int* Bend,
                                const Int* Bi, const double* Bx,
                                double pivottol, bool strict_abs_pivottol,
                                SparseMatrix* L, SparseMatrix* U,
                                std::vector<Int>* rowperm,
                                std::vector<Int>* colperm,
                                std::vector<Int>* dependent_cols) {
    _Factorize(dim, Bbegin, Bend, Bi, Bx, pivottol, strict_abs_pivottol,
               L, U, rowperm, colperm, dependent_cols);
    stability_ = StabilityEstimate(Bbegin, Bend, Bi, Bx, *L, *U, *rowperm,
                                   *colperm, *dependent_cols);
}